

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

int loader_impl_load_from_file
              (plugin_manager manager,plugin p,loader_impl impl,loader_path *paths,size_t size,
              void **handle_ptr)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  void *pvVar4;
  loader_handle_impl handle_impl_00;
  long lVar5;
  loader_handle_impl plVar6;
  undefined8 in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  loader_handle_impl iterator_handle_impl_1;
  size_t iterator_1;
  loader_handle_impl iterator_handle_impl;
  size_t iterator;
  loader_handle_impl handle_impl;
  size_t init_order;
  loader_path path;
  loader_handle handle;
  loader_impl_interface iface;
  loader_impl in_stack_ffffffffffffef68;
  char *in_stack_ffffffffffffef70;
  loader_handle in_stack_ffffffffffffef78;
  loader_handle_impl plVar7;
  loader_impl_interface in_stack_ffffffffffffef80;
  loader_impl in_stack_ffffffffffffef88;
  loader_handle_impl in_stack_ffffffffffffef90;
  void **in_stack_ffffffffffffef98;
  loader_handle_impl in_stack_ffffffffffffefa0;
  plugin_manager in_stack_ffffffffffffefa8;
  plugin_manager in_stack_ffffffffffffefb8;
  loader_impl in_stack_ffffffffffffefd8;
  plugin in_stack_ffffffffffffefe0;
  plugin_manager in_stack_ffffffffffffefe8;
  
  if ((in_RDX != 0) && (lVar2 = plugin_iface(in_RSI), lVar2 != 0)) {
    iVar1 = loader_impl_initialize
                      (in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8
                      );
    if (iVar1 != 0) {
      return 1;
    }
    sVar3 = loader_impl_handle_name
                      (in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0,
                       (char *)in_stack_ffffffffffffef98);
    if ((1 < sVar3) &&
       (pvVar4 = loader_impl_get_handle(in_stack_ffffffffffffef68,(char *)0x1071be),
       pvVar4 != (void *)0x0)) {
      log_write_impl_va("metacall",0x37b,"loader_impl_load_from_file",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                        ,3,"Load from file handle failed, handle with name %s already loaded",
                        &stack0xffffffffffffefb8);
      return 1;
    }
    handle_impl_00 = (loader_handle_impl)vector_size(*(undefined8 *)(in_RDX + 0x20));
    vector_push_back_empty(*(undefined8 *)(in_RDX + 0x20));
    lVar5 = (**(code **)(lVar2 + 0x10))(in_RDX,in_RCX,in_R8);
    if (lVar5 == 0) {
      while( true ) {
        plVar7 = (loader_handle_impl)((long)&handle_impl_00->magic + 1);
        handle_impl_00 = plVar7;
        plVar6 = (loader_handle_impl)vector_size(*(undefined8 *)(in_RDX + 0x20));
        if (plVar6 <= plVar7) break;
        vector_at(*(undefined8 *)(in_RDX + 0x20),handle_impl_00);
        loader_impl_destroy_handle(handle_impl_00);
      }
      vector_pop_back(*(undefined8 *)(in_RDX + 0x20));
    }
    else {
      plVar6 = loader_impl_load_handle
                         (in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
                          in_stack_ffffffffffffef78,in_stack_ffffffffffffef70,
                          (size_t)in_stack_ffffffffffffef68);
      if (plVar6 != (loader_handle_impl)0x0) {
        plVar6->populated = 1;
        iVar1 = set_insert(*(undefined8 *)(in_RDX + 0x10),plVar6->path,plVar6);
        if (iVar1 == 0) {
          iVar1 = set_insert(*(undefined8 *)(in_RDX + 0x18),plVar6->module,plVar6);
          if (iVar1 == 0) {
            iVar1 = (**(code **)(lVar2 + 0x30))(in_RDX,plVar6->module,plVar6->ctx);
            if ((iVar1 == 0) &&
               (iVar1 = loader_impl_handle_register
                                  (in_stack_ffffffffffffefb8,(loader_impl)handle_impl_00,
                                   (char *)plVar6,in_stack_ffffffffffffefa0,
                                   in_stack_ffffffffffffef98), iVar1 == 0)) {
              vector_set(*(undefined8 *)(in_RDX + 0x20),handle_impl_00,&stack0xffffffffffffefa8);
              return 0;
            }
            set_remove(*(undefined8 *)(in_RDX + 0x18),plVar6->module);
          }
          set_remove(*(undefined8 *)(in_RDX + 0x10),plVar6->path);
        }
        while( true ) {
          plVar7 = (loader_handle_impl)((long)&handle_impl_00->magic + 1);
          handle_impl_00 = plVar7;
          plVar6 = (loader_handle_impl)vector_size(*(undefined8 *)(in_RDX + 0x20));
          if (plVar6 <= plVar7) break;
          vector_at(*(undefined8 *)(in_RDX + 0x20),handle_impl_00);
          loader_impl_destroy_handle(in_stack_ffffffffffffef90);
        }
        vector_pop_back(*(undefined8 *)(in_RDX + 0x20));
        log_write_impl_va("metacall",0x3b5,"loader_impl_load_from_file",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                          ,3,"Error when loading handle: %s",&stack0xffffffffffffefb8);
        loader_impl_destroy_handle(in_stack_ffffffffffffef90);
      }
    }
  }
  return 1;
}

Assistant:

int loader_impl_load_from_file(plugin_manager manager, plugin p, loader_impl impl, const loader_path paths[], size_t size, void **handle_ptr)
{
	if (impl != NULL)
	{
		loader_impl_interface iface = loader_iface(p);

		/* TODO: Disable logs here until log is completely thread safe and async signal safe */
		/*
		size_t iterator;

		for (iterator = 0; iterator < size; ++iterator)
		{
			log_write("metacall", LOG_LEVEL_DEBUG, "Loading %s", paths[iterator]);
		}
		*/

		if (iface != NULL)
		{
			loader_handle handle;
			loader_path path;
			size_t init_order;

			if (loader_impl_initialize(manager, p, impl) != 0)
			{
				return 1;
			}

			if (loader_impl_handle_name(manager, paths[0], path) > 1 && loader_impl_get_handle(impl, path) != NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Load from file handle failed, handle with name %s already loaded", path);

				return 1;
			}

			init_order = vector_size(impl->handle_impl_init_order);

			vector_push_back_empty(impl->handle_impl_init_order);

			handle = iface->load_from_file(impl, paths, size);

			/* TODO: Disable logs here until log is completely thread safe and async signal safe */
			/* log_write("metacall", LOG_LEVEL_DEBUG, "Loader interface: %p - Loader handle: %p", (void *)iface, (void *)handle); */

			if (handle != NULL)
			{
				loader_handle_impl handle_impl = loader_impl_load_handle(impl, iface, handle, path, LOADER_PATH_SIZE);

				/* TODO: Disable logs here until log is completely thread safe and async signal safe */
				/* log_write("metacall", LOG_LEVEL_DEBUG, "Loader handle impl: %p", (void *)handle_impl); */

				if (handle_impl != NULL)
				{
					handle_impl->populated = 1;

					if (set_insert(impl->handle_impl_path_map, handle_impl->path, handle_impl) == 0)
					{
						if (set_insert(impl->handle_impl_map, handle_impl->module, handle_impl) == 0)
						{
							if (iface->discover(impl, handle_impl->module, handle_impl->ctx) == 0)
							{
								if (loader_impl_handle_register(manager, impl, path, handle_impl, handle_ptr) == 0)
								{
									vector_set_var(impl->handle_impl_init_order, init_order, handle_impl);

									return 0;
								}
							}

							set_remove(impl->handle_impl_map, handle_impl->module);
						}

						set_remove(impl->handle_impl_path_map, handle_impl->path);
					}

					{
						size_t iterator;

						for (iterator = init_order + 1; iterator < vector_size(impl->handle_impl_init_order); ++iterator)
						{
							loader_handle_impl iterator_handle_impl = vector_at_type(impl->handle_impl_init_order, iterator, loader_handle_impl);

							loader_impl_destroy_handle(iterator_handle_impl);
						}

						vector_pop_back(impl->handle_impl_init_order);
					}

					log_write("metacall", LOG_LEVEL_ERROR, "Error when loading handle: %s", path);

					loader_impl_destroy_handle(handle_impl);
				}
			}
			else
			{
				size_t iterator;

				for (iterator = init_order + 1; iterator < vector_size(impl->handle_impl_init_order); ++iterator)
				{
					loader_handle_impl iterator_handle_impl = vector_at_type(impl->handle_impl_init_order, iterator, loader_handle_impl);

					loader_impl_destroy_handle(iterator_handle_impl);
				}

				vector_pop_back(impl->handle_impl_init_order);
			}
		}
	}

	return 1;
}